

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

void __thiscall sf::RenderTarget::pushGLStates(RenderTarget *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  
  bVar1 = anon_unknown.dwarf_86b03::isActive(this->m_id);
  if (!bVar1) {
    iVar2 = (*this->_vptr_RenderTarget[3])(this,1);
    if ((char)iVar2 == '\0') goto LAB_0012cd98;
  }
  iVar2 = glGetError();
  if (iVar2 != 0) {
    poVar3 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"OpenGL error (",0xe);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") detected in user code, ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"you should check for errors with glGetError()",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  glPushClientAttrib(0xffffffff);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1bf,"glPushClientAttrib(GL_CLIENT_ALL_ATTRIB_BITS)");
  glPushAttrib(0xffffffff);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1c0,"glPushAttrib(GL_ALL_ATTRIB_BITS)");
  glMatrixMode(0x1700);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1c2,"glMatrixMode(GL_MODELVIEW)");
  glPushMatrix();
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1c3,"glPushMatrix()");
  glMatrixMode(0x1701);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1c4,"glMatrixMode(GL_PROJECTION)");
  glPushMatrix();
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1c5,"glPushMatrix()");
  glMatrixMode(0x1702);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1c6,"glMatrixMode(GL_TEXTURE)");
  glPushMatrix();
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1c7,"glPushMatrix()");
LAB_0012cd98:
  resetGLStates(this);
  return;
}

Assistant:

void RenderTarget::pushGLStates()
{
    if (isActive(m_id) || setActive(true))
    {
        #ifdef SFML_DEBUG
            // make sure that the user didn't leave an unchecked OpenGL error
            GLenum error = glGetError();
            if (error != GL_NO_ERROR)
            {
                err() << "OpenGL error (" << error << ") detected in user code, "
                      << "you should check for errors with glGetError()"
                      << std::endl;
            }
        #endif

        #ifndef SFML_OPENGL_ES
            glCheck(glPushClientAttrib(GL_CLIENT_ALL_ATTRIB_BITS));
            glCheck(glPushAttrib(GL_ALL_ATTRIB_BITS));
        #endif
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_PROJECTION));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glPushMatrix());
    }

    resetGLStates();
}